

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool __thiscall
ON_Internal_ExtrudedEdge::SetSideGroupIdFromVertexPairs(ON_Internal_ExtrudedEdge *this)

{
  uint side_group_id;
  bool bVar1;
  ulong uVar2;
  
  if (this->m_side_group_id != 0) {
    return false;
  }
  uVar2 = 0;
  while( true ) {
    if (uVar2 == 2) {
      return false;
    }
    if ((this->m_extruded_vertex[uVar2] != (ON_Internal_ExtrudedVertex *)0x0) &&
       (side_group_id = this->m_extruded_vertex[uVar2]->m_side_group_id, side_group_id != 0)) break;
    uVar2 = uVar2 + 1;
  }
  bVar1 = SetSideGroupId(this,side_group_id);
  return bVar1 && uVar2 < 2;
}

Assistant:

bool SetSideGroupIdFromVertexPairs()
  {
    if (m_side_group_id > 0)
      return false;
    for (unsigned evi = 0; evi < 2; ++evi)
    {
      if (nullptr != m_extruded_vertex[evi] && m_extruded_vertex[evi]->m_side_group_id > 0)
        return SetSideGroupId(m_extruded_vertex[evi]->m_side_group_id);
    }
    return false;
  }